

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestCoverageHandler::StartCoverageLogFile
          (cmCTestCoverageHandler *this,cmGeneratedFileStream *covLogFile,int logFileCount)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  undefined4 in_register_00000014;
  char *local_5c0 [4];
  ostringstream cmCTestLog_msg;
  char covLogFilename [1024];
  
  sprintf(covLogFilename,"CoverageLog-%d",CONCAT44(in_register_00000014,logFileCount));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Open file: ");
  poVar3 = std::operator<<(poVar3,covLogFilename);
  std::endl<char,std::char_traits<char>>(poVar3);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x97,local_5c0[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_5c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar2 = cmCTestGenericHandler::StartResultingXML
                    (&this->super_cmCTestGenericHandler,PartCoverage,covLogFilename,covLogFile);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Cannot open log file: ");
    poVar3 = std::operator<<(poVar3,covLogFilename);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x9b,local_5c0[0],false);
    std::__cxx11::string::~string((string *)local_5c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  return bVar2;
}

Assistant:

bool cmCTestCoverageHandler::StartCoverageLogFile(
  cmGeneratedFileStream& covLogFile, int logFileCount)
{
  char covLogFilename[1024];
  sprintf(covLogFilename, "CoverageLog-%d", logFileCount);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Open file: " << covLogFilename << std::endl,
                     this->Quiet);
  if (!this->StartResultingXML(cmCTest::PartCoverage, covLogFilename,
                               covLogFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open log file: " << covLogFilename << std::endl);
    return false;
  }
  return true;
}